

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

string * __thiscall
libcellml::Importer::key_abi_cxx11_(string *__return_storage_ptr__,Importer *this,size_t *index)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  _Rb_tree_node_base *p_Var3;
  size_t sVar4;
  
  puVar1 = (pointer)*index;
  pLVar2 = Logger::pFunc(&this->super_Logger);
  if (puVar1 < pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    pLVar2 = Logger::pFunc(&this->super_Logger);
    p_Var3 = (_Rb_tree_node_base *)
             pLVar2[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (sVar4 = *index; sVar4 != 0; sVar4 = sVar4 - 1) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(p_Var3 + 1),
               (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Importer::key(const size_t &index)
{
    if (index >= pFunc()->mLibrary.size()) {
        return "";
    }
    auto it = pFunc()->mLibrary.begin();
    size_t i = 0;
    while (i < index) {
        ++it;
        ++i;
    }
    return it->first;
}